

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O3

TIntermTyped * __thiscall
glslang::HlslParseContext::handleFunctionCall
          (HlslParseContext *this,TSourceLoc *loc,TFunction *function,TIntermTyped *arguments)

{
  undefined1 *puVar1;
  pointer pbVar2;
  pointer ppTVar3;
  TIntermediate *pTVar4;
  TString name;
  TString structName;
  TIntermConstantUnion *pTVar5;
  bool bVar6;
  char cVar7;
  TOperator TVar8;
  int iVar9;
  int iVar10;
  undefined4 extraout_var;
  long *plVar11;
  long lVar12;
  undefined4 extraout_var_01;
  HlslParseContext *pHVar13;
  undefined4 extraout_var_02;
  TType *pTVar14;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  TSymbol *pTVar15;
  undefined4 extraout_var_06;
  TFunction *function_00;
  undefined4 extraout_var_07;
  TIntermSymbol *front;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  vector<glslang::TStorageQualifier,glslang::pool_allocator<glslang::TStorageQualifier>> *this_00;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  TStorageQualifier *pTVar16;
  TOperator op;
  uint uVar17;
  iterator iVar18;
  TIntermTyped *pTVar19;
  char *__end;
  undefined7 uStack_178;
  bool builtIn;
  TIntermConstantUnion *local_170;
  TIntermTyped *arguments_local;
  undefined4 uStack_160;
  int thisDepth;
  HlslParseContext *local_158;
  TSourceLoc *local_150;
  TIntermConstantUnion *local_148;
  TStorageQualifier qual;
  undefined4 uStack_13c;
  pointer local_138;
  TPoolAllocator *local_118;
  undefined1 *local_110;
  undefined1 local_100 [16];
  TType type;
  TPoolAllocator *local_58;
  _Base_ptr local_50;
  undefined4 extraout_var_00;
  
  local_170 = (TIntermConstantUnion *)0x0;
  arguments_local = arguments;
  TVar8 = (*(function->super_TSymbol)._vptr_TSymbol[0x1b])(function);
  if (TVar8 != EOpNull) {
    TType::TType(&type,EbtVoid,EvqTemporary,1,0,0,false);
    bVar6 = constructorError(this,loc,&arguments->super_TIntermNode,function,TVar8,&type);
    if ((!bVar6) &&
       (local_170 = (TIntermConstantUnion *)handleConstructor(this,loc,arguments,&type),
       local_170 == (TIntermConstantUnion *)0x0)) {
      local_118 = GetThreadPoolAllocator();
      local_110 = local_100;
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      _M_construct<char_const*>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_118,"","");
      local_58 = GetThreadPoolAllocator();
      local_50 = (_Base_ptr)&stack0xffffffffffffffc0;
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      _M_construct<char_const*>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_58,"","");
      name._M_dataplus._M_p = (pointer)&local_58;
      name._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)&local_118;
      name._M_string_length._0_7_ = uStack_178;
      name._M_string_length._7_1_ = builtIn;
      name.field_2._M_allocated_capacity = (size_type)local_170;
      name.field_2._8_8_ = arguments_local;
      structName._M_dataplus.super_allocator_type.allocator._4_4_ = thisDepth;
      structName._M_dataplus.super_allocator_type.allocator._0_4_ = uStack_160;
      structName._M_dataplus._M_p = (pointer)local_158;
      structName._M_string_length = (size_type)local_150;
      structName.field_2._M_allocated_capacity = (size_type)local_148;
      structName.field_2._8_4_ = qual;
      structName.field_2._12_4_ = uStack_13c;
      TType::getCompleteString((TString *)&qual,&type,false,true,true,true,name,structName);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"cannot construct with these arguments",local_138,"");
      return (TIntermTyped *)0x0;
    }
    goto LAB_00383dbd;
  }
  builtIn = false;
  thisDepth = 0;
  iVar9 = (*(function->super_TSymbol)._vptr_TSymbol[3])(function);
  iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                  CONCAT44(extraout_var,iVar9),"mul");
  if (iVar9 == 0) {
    addGenMulArgumentConversion(this,loc,function,&arguments_local);
  }
  local_158 = this;
  if (arguments == (TIntermTyped *)0x0) {
LAB_00383a31:
    function_00 = findFunction(this,loc,function,&builtIn,&thisDepth,&arguments_local);
    if (function_00 == (TFunction *)0x0) goto LAB_00383dbd;
  }
  else {
    iVar9 = (*(arguments->super_TIntermNode)._vptr_TIntermNode[6])(arguments);
    plVar11 = (long *)CONCAT44(extraout_var_00,iVar9);
    if (((plVar11 == (long *)0x0) ||
        (lVar12 = (**(code **)(*plVar11 + 400))(plVar11),
        *(long *)(lVar12 + 0x10) == *(long *)(lVar12 + 8))) ||
       (lVar12 = (**(code **)(*plVar11 + 400))(plVar11), **(long **)(lVar12 + 8) == 0)) {
      iVar9 = (*(arguments->super_TIntermNode)._vptr_TIntermNode[0xc])(arguments);
      lVar12 = 0x60;
      if (CONCAT44(extraout_var_01,iVar9) == 0) goto LAB_00383a31;
    }
    else {
      lVar12 = (**(code **)(*plVar11 + 400))(plVar11);
      arguments = (TIntermTyped *)**(undefined8 **)(lVar12 + 8);
      lVar12 = 0x18;
    }
    pHVar13 = (HlslParseContext *)
              (**(code **)((long)(arguments->super_TIntermNode)._vptr_TIntermNode + lVar12))
                        (arguments);
    if (pHVar13 == (HlslParseContext *)0x0) goto LAB_00383a31;
    iVar9 = (*(pHVar13->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x1e])();
    pTVar14 = getStructBufferContentType(pHVar13,(TType *)CONCAT44(extraout_var_02,iVar9));
    if ((pTVar14 == (TType *)0x0) ||
       (iVar9 = (*(function->super_TSymbol)._vptr_TSymbol[3])(function),
       *(ulong *)(CONCAT44(extraout_var_03,iVar9) + 0x10) < 6)) goto LAB_00383a31;
    iVar9 = (*(function->super_TSymbol)._vptr_TSymbol[3])(function);
    pHVar13 = (HlslParseContext *)&type;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::substr
              ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)&type,
               (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               CONCAT44(extraout_var_04,iVar9),5,0xffffffffffffffff);
    bVar6 = isStructBufferMethod(pHVar13,(TString *)&type);
    if (!bVar6) goto LAB_00383a31;
    iVar9 = (*(function->super_TSymbol)._vptr_TSymbol[3])(function);
    type._vptr_TType = (_func_int **)GetThreadPoolAllocator();
    this = local_158;
    lVar12 = *(long *)(CONCAT44(extraout_var_05,iVar9) + 8);
    type._8_8_ = &type.qualifier.field_0x8;
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                        &type,lVar12,*(long *)(CONCAT44(extraout_var_05,iVar9) + 0x10) + lVar12);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)&type,
               "(");
    pTVar15 = TSymbolTable::find((this->super_TParseContextBase).symbolTable,(TString *)&type,
                                 &builtIn,(bool *)0x0,(int *)0x0);
    if (pTVar15 == (TSymbol *)0x0) goto LAB_00383a31;
    iVar9 = (*pTVar15->_vptr_TSymbol[7])(pTVar15);
    function_00 = (TFunction *)CONCAT44(extraout_var_06,iVar9);
    if (function_00 == (TFunction *)0x0) goto LAB_00383a31;
  }
  puVar1 = &type.qualifier.field_0x8;
  type._vptr_TType = (_func_int **)GetThreadPoolAllocator();
  type.qualifier.semanticName = (char *)0x0;
  type.qualifier._8_1_ = 0;
  type._8_8_ = puVar1;
  if ((long)thisDepth == 0) {
    iVar9 = (*(function_00->super_TSymbol)._vptr_TSymbol[6])(function_00);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    _M_assign((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)&type,
              (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
              CONCAT44(extraout_var_08,iVar9));
  }
  else {
    pbVar2 = (this->currentTypePrefix).
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    _M_assign((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)&type,
              pbVar2 + (((ulong)((long)(this->currentTypePrefix).
                                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
                                       .
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) >>
                        3) * -0x3333333333333333 - (long)thisDepth));
    iVar9 = (*(function_00->super_TSymbol)._vptr_TSymbol[6])(function_00);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    _M_append((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)&type,
              *(char **)(CONCAT44(extraout_var_07,iVar9) + 8),
              *(size_type *)(CONCAT44(extraout_var_07,iVar9) + 0x10));
    ppTVar3 = (this->implicitThisStack).
              super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
              super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    front = TIntermediate::addSymbol
                      ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                       ppTVar3[((ulong)((long)(this->implicitThisStack).
                                              super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                                              .
                                              super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)ppTVar3) >> 3) - (long)thisDepth]);
    pushFrontArguments(this,&front->super_TIntermTyped,&arguments_local);
  }
  if (((arguments_local == (TIntermTyped *)0x0) ||
      (addInputArgumentConversions(this,function_00,&arguments_local),
      arguments_local == (TIntermTyped *)0x0)) ||
     ((builtIn == false &&
      (expandArguments(this,loc,function_00,&arguments_local),
      arguments_local == (TIntermTyped *)0x0)))) {
    pTVar19 = (TIntermTyped *)0x0;
  }
  else {
    pTVar19 = arguments_local;
    (*(arguments_local->super_TIntermNode)._vptr_TIntermNode[6])(arguments_local);
  }
  TVar8 = (*(function_00->super_TSymbol)._vptr_TSymbol[0x1b])(function_00);
  local_150 = loc;
  if ((TVar8 == EOpNull) || (builtIn == false)) {
    pTVar4 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    iVar9 = (*(function_00->super_TSymbol)._vptr_TSymbol[0xc])(function_00);
    local_170 = (TIntermConstantUnion *)
                TIntermediate::setAggregateOperator
                          (pTVar4,&pTVar19->super_TIntermNode,EOpFunctionCall,
                           (TType *)CONCAT44(extraout_var_12,iVar9),loc);
    iVar9 = (*(local_170->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[6])(local_170);
    plVar11 = (long *)CONCAT44(extraout_var_13,iVar9);
    (**(code **)(*plVar11 + 0x1a0))(plVar11,&type);
    if (builtIn == false) {
      (**(code **)(*plVar11 + 0x1b0))(plVar11);
      TIntermediate::addToCallGraph
                ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                 (this->super_TParseContextBase).super_TParseVersions.infoSink,&this->currentCaller,
                 (TString *)&type);
    }
  }
  else {
    op = EOpRoundEven;
    if (TVar8 != EOpRound ||
        ((this->super_TParseContextBase).super_TParseVersions.messages & EShMsgHlslDX9Compatible) !=
        EShMsgDefault) {
      op = TVar8;
    }
    pTVar4 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    iVar9 = (*(function_00->super_TSymbol)._vptr_TSymbol[0x24])(function_00);
    iVar10 = (*(function_00->super_TSymbol)._vptr_TSymbol[0xc])(function_00);
    local_170 = (TIntermConstantUnion *)
                TIntermediate::addBuiltInFunctionCall
                          (pTVar4,loc,op,iVar9 == 1,&pTVar19->super_TIntermNode,
                           (TType *)CONCAT44(extraout_var_09,iVar10));
    pTVar19 = arguments_local;
    if (local_170 == (TIntermConstantUnion *)0x0) {
      iVar9 = (**(arguments_local->super_TIntermNode)._vptr_TIntermNode)(arguments_local);
      TIntermTyped::getCompleteString_abi_cxx11_((TString *)&qual,pTVar19,false);
      this = local_158;
      (*(local_158->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (local_158,CONCAT44(extraout_var_14,iVar9)," wrong operand type","Internal Error",
                 "built in unary operator function.  Type: %s",local_138);
      loc = local_150;
    }
    else {
      iVar9 = (*(local_170->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[4])(local_170);
      loc = local_150;
      this = local_158;
      if (CONCAT44(extraout_var_10,iVar9) != 0) {
        iVar9 = (*(local_170->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[4])();
        builtInOpCheck(this,loc,function_00,(TIntermOperator *)CONCAT44(extraout_var_11,iVar9));
      }
    }
  }
  pTVar19 = arguments_local;
  pTVar5 = local_170;
  decomposeStructBufferMethods
            (this,loc,(TIntermTyped **)&local_170,&arguments_local->super_TIntermNode);
  decomposeIntrinsic(this,loc,(TIntermTyped **)&local_170,&pTVar19->super_TIntermNode);
  decomposeSampleMethods(this,loc,(TIntermTyped **)&local_170,&pTVar19->super_TIntermNode);
  decomposeGeometryMethods(this,loc,(TIntermTyped **)&local_170,&pTVar19->super_TIntermNode);
  local_148 = pTVar5;
  if ((local_170 == pTVar5) &&
     (iVar9 = (*(local_170->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[6])(),
     CONCAT44(extraout_var_17,iVar9) != 0)) {
    iVar9 = (*(local_170->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[6])();
    this_00 = (vector<glslang::TStorageQualifier,glslang::pool_allocator<glslang::TStorageQualifier>>
               *)(**(code **)(*(long *)CONCAT44(extraout_var_18,iVar9) + 0x1c0))
                           ((long *)CONCAT44(extraout_var_18,iVar9));
    iVar9 = (*(function_00->super_TSymbol)._vptr_TSymbol[0x24])(function_00);
    if (0 < iVar9) {
      uVar17 = 0;
      do {
        iVar9 = (*(function_00->super_TSymbol)._vptr_TSymbol[0x28])(function_00,(ulong)uVar17);
        lVar12 = (**(code **)(**(long **)(CONCAT44(extraout_var_19,iVar9) + 8) + 0x50))();
        qual = *(TStorageQualifier *)(lVar12 + 8) & 0x7f;
        iVar9 = (*(function_00->super_TSymbol)._vptr_TSymbol[0x28])(function_00,(ulong)uVar17);
        lVar12 = (**(code **)(**(long **)(CONCAT44(extraout_var_20,iVar9) + 8) + 0x58))();
        if ((*(uint *)(lVar12 + 8) & 0x1fe0000) == 0x960000) {
          iVar18._M_current = *(TStorageQualifier **)(this_00 + 0x10);
          pTVar16 = *(TStorageQualifier **)(this_00 + 0x18);
          if (iVar18._M_current == pTVar16) {
            std::
            vector<glslang::TStorageQualifier,glslang::pool_allocator<glslang::TStorageQualifier>>::
            _M_realloc_insert<glslang::TStorageQualifier_const&>(this_00,iVar18,&qual);
            iVar18._M_current = *(TStorageQualifier **)(this_00 + 0x10);
            pTVar16 = *(TStorageQualifier **)(this_00 + 0x18);
          }
          else {
            *iVar18._M_current = qual;
            iVar18._M_current = iVar18._M_current + 1;
            *(TStorageQualifier **)(this_00 + 0x10) = iVar18._M_current;
          }
          if (iVar18._M_current == pTVar16) {
LAB_00383f8f:
            std::
            vector<glslang::TStorageQualifier,glslang::pool_allocator<glslang::TStorageQualifier>>::
            _M_realloc_insert<glslang::TStorageQualifier_const&>(this_00,iVar18,&qual);
          }
          else {
LAB_00383fb6:
            *iVar18._M_current = qual;
            *(TStorageQualifier **)(this_00 + 0x10) = iVar18._M_current + 1;
          }
        }
        else {
          iVar9 = (*(function_00->super_TSymbol)._vptr_TSymbol[0x28])(function_00,(ulong)uVar17);
          pTVar14 = *(TType **)(CONCAT44(extraout_var_21,iVar9) + 8);
          iVar9 = (*(function_00->super_TSymbol)._vptr_TSymbol[0x28])(function_00,(ulong)uVar17);
          lVar12 = (**(code **)(**(long **)(CONCAT44(extraout_var_22,iVar9) + 8) + 0x50))();
          bVar6 = shouldFlatten(this,pTVar14,*(TStorageQualifier *)(lVar12 + 8) & 0x7f,true);
          if (!bVar6) {
            iVar18._M_current = *(TStorageQualifier **)(this_00 + 0x10);
            if (iVar18._M_current == *(TStorageQualifier **)(this_00 + 0x18)) goto LAB_00383f8f;
            goto LAB_00383fb6;
          }
          iVar9 = (*(function_00->super_TSymbol)._vptr_TSymbol[0x28])(function_00,(ulong)uVar17);
          plVar11 = *(long **)(CONCAT44(extraout_var_23,iVar9) + 8);
          cVar7 = (**(code **)(*plVar11 + 0x128))(plVar11);
          if (cVar7 == '\0') {
LAB_00383fe5:
            __assert_fail("isStruct()",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                          ,0x9df,"const TTypeList *glslang::TType::getStruct() const");
          }
          iVar9 = -1;
          while (iVar9 = iVar9 + 1,
                iVar9 < (int)((ulong)(*(long *)(plVar11[0xd] + 0x10) - *(long *)(plVar11[0xd] + 8))
                             >> 5)) {
            iVar18._M_current = *(TStorageQualifier **)(this_00 + 0x10);
            if (iVar18._M_current == *(TStorageQualifier **)(this_00 + 0x18)) {
              std::
              vector<glslang::TStorageQualifier,glslang::pool_allocator<glslang::TStorageQualifier>>
              ::_M_realloc_insert<glslang::TStorageQualifier_const&>(this_00,iVar18,&qual);
            }
            else {
              *iVar18._M_current = qual;
              *(TStorageQualifier **)(this_00 + 0x10) = iVar18._M_current + 1;
            }
            iVar10 = (*(function_00->super_TSymbol)._vptr_TSymbol[0x28])(function_00,(ulong)uVar17);
            plVar11 = *(long **)(CONCAT44(extraout_var_24,iVar10) + 8);
            cVar7 = (**(code **)(*plVar11 + 0x128))(plVar11);
            if (cVar7 == '\0') goto LAB_00383fe5;
          }
        }
        uVar17 = uVar17 + 1;
        iVar9 = (*(function_00->super_TSymbol)._vptr_TSymbol[0x24])(function_00);
        this = local_158;
      } while ((int)uVar17 < iVar9);
    }
  }
  loc = local_150;
  if ((local_170 == local_148) &&
     (iVar9 = (*(local_170->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[6])(),
     loc = local_150, CONCAT44(extraout_var_15,iVar9) != 0)) {
    iVar9 = (*(local_170->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[4])();
    local_170 = (TIntermConstantUnion *)
                addOutputArgumentConversions
                          (this,function_00,(TIntermOperator *)CONCAT44(extraout_var_16,iVar9));
    loc = local_150;
  }
LAB_00383dbd:
  if (local_170 == (TIntermConstantUnion *)0x0) {
    local_170 = TIntermediate::addConstantUnion
                          ((this->super_TParseContextBase).super_TParseVersions.intermediate,0.0,
                           EbtFloat,loc,false);
  }
  return &local_170->super_TIntermTyped;
}

Assistant:

TIntermTyped* HlslParseContext::handleFunctionCall(const TSourceLoc& loc, TFunction* function, TIntermTyped* arguments)
{
    TIntermTyped* result = nullptr;

    TOperator op = function->getBuiltInOp();
    if (op != EOpNull) {
        //
        // Then this should be a constructor.
        // Don't go through the symbol table for constructors.
        // Their parameters will be verified algorithmically.
        //
        TType type(EbtVoid);  // use this to get the type back
        if (! constructorError(loc, arguments, *function, op, type)) {
            //
            // It's a constructor, of type 'type'.
            //
            result = handleConstructor(loc, arguments, type);
            if (result == nullptr) {
                error(loc, "cannot construct with these arguments", type.getCompleteString().c_str(), "");
                return nullptr;
            }
        }
    } else {
        //
        // Find it in the symbol table.
        //
        const TFunction* fnCandidate = nullptr;
        bool builtIn = false;
        int thisDepth = 0;

        // For mat mul, the situation is unusual: we have to compare vector sizes to mat row or col sizes,
        // and clamp the opposite arg.  Since that's complex, we farm it off to a separate method.
        // It doesn't naturally fall out of processing an argument at a time in isolation.
        if (function->getName() == "mul")
            addGenMulArgumentConversion(loc, *function, arguments);

        TIntermAggregate* aggregate = arguments ? arguments->getAsAggregate() : nullptr;

        // TODO: this needs improvement: there's no way at present to look up a signature in
        // the symbol table for an arbitrary type.  This is a temporary hack until that ability exists.
        // It will have false positives, since it doesn't check arg counts or types.
        if (arguments) {
            // Check if first argument is struct buffer type.  It may be an aggregate or a symbol, so we
            // look for either case.

            TIntermTyped* arg0 = nullptr;

            if (aggregate && aggregate->getSequence().size() > 0 && aggregate->getSequence()[0])
                arg0 = aggregate->getSequence()[0]->getAsTyped();
            else if (arguments->getAsSymbolNode())
                arg0 = arguments->getAsSymbolNode();

            if (arg0 != nullptr && isStructBufferType(arg0->getType())) {
                static const int methodPrefixSize = sizeof(BUILTIN_PREFIX)-1;

                if (function->getName().length() > methodPrefixSize &&
                    isStructBufferMethod(function->getName().substr(methodPrefixSize))) {
                    const TString mangle = function->getName() + "(";
                    TSymbol* symbol = symbolTable.find(mangle, &builtIn);

                    if (symbol)
                        fnCandidate = symbol->getAsFunction();
                }
            }
        }

        if (fnCandidate == nullptr)
            fnCandidate = findFunction(loc, *function, builtIn, thisDepth, arguments);

        if (fnCandidate) {
            // This is a declared function that might map to
            //  - a built-in operator,
            //  - a built-in function not mapped to an operator, or
            //  - a user function.

            // turn an implicit member-function resolution into an explicit call
            TString callerName;
            if (thisDepth == 0)
                callerName = fnCandidate->getMangledName();
            else {
                // get the explicit (full) name of the function
                callerName = currentTypePrefix[currentTypePrefix.size() - thisDepth];
                callerName += fnCandidate->getMangledName();
                // insert the implicit calling argument
                pushFrontArguments(intermediate.addSymbol(*getImplicitThis(thisDepth)), arguments);
            }

            // Convert 'in' arguments, so that types match.
            // However, skip those that need expansion, that is covered next.
            if (arguments)
                addInputArgumentConversions(*fnCandidate, arguments);

            // Expand arguments.  Some arguments must physically expand to a different set
            // than what the shader declared and passes.
            if (arguments && !builtIn)
                expandArguments(loc, *fnCandidate, arguments);

            // Expansion may have changed the form of arguments
            aggregate = arguments ? arguments->getAsAggregate() : nullptr;

            op = fnCandidate->getBuiltInOp();
            if (builtIn && op != EOpNull) {
                // SM 4.0 and above guarantees roundEven semantics for round()
                if (!hlslDX9Compatible() && op == EOpRound)
                    op = EOpRoundEven;

                // A function call mapped to a built-in operation.
                result = intermediate.addBuiltInFunctionCall(loc, op, fnCandidate->getParamCount() == 1, arguments,
                                                             fnCandidate->getType());
                if (result == nullptr)  {
                    error(arguments->getLoc(), " wrong operand type", "Internal Error",
                        "built in unary operator function.  Type: %s",
                        static_cast<TIntermTyped*>(arguments)->getCompleteString().c_str());
                } else if (result->getAsOperator()) {
                    builtInOpCheck(loc, *fnCandidate, *result->getAsOperator());
                }
            } else {
                // This is a function call not mapped to built-in operator.
                // It could still be a built-in function, but only if PureOperatorBuiltins == false.
                result = intermediate.setAggregateOperator(arguments, EOpFunctionCall, fnCandidate->getType(), loc);
                TIntermAggregate* call = result->getAsAggregate();
                call->setName(callerName);

                // this is how we know whether the given function is a built-in function or a user-defined function
                // if builtIn == false, it's a userDefined -> could be an overloaded built-in function also
                // if builtIn == true, it's definitely a built-in function with EOpNull
                if (! builtIn) {
                    call->setUserDefined();
                    intermediate.addToCallGraph(infoSink, currentCaller, callerName);
                }
            }

            // for decompositions, since we want to operate on the function node, not the aggregate holding
            // output conversions.
            const TIntermTyped* fnNode = result;

            decomposeStructBufferMethods(loc, result, arguments); // HLSL->AST struct buffer method decompositions
            decomposeIntrinsic(loc, result, arguments);           // HLSL->AST intrinsic decompositions
            decomposeSampleMethods(loc, result, arguments);       // HLSL->AST sample method decompositions
            decomposeGeometryMethods(loc, result, arguments);     // HLSL->AST geometry method decompositions

            // Create the qualifier list, carried in the AST for the call.
            // Because some arguments expand to multiple arguments, the qualifier list will
            // be longer than the formal parameter list.
            if (result == fnNode && result->getAsAggregate()) {
                TQualifierList& qualifierList = result->getAsAggregate()->getQualifierList();
                for (int i = 0; i < fnCandidate->getParamCount(); ++i) {
                    TStorageQualifier qual = (*fnCandidate)[i].type->getQualifier().storage;
                    if (hasStructBuffCounter(*(*fnCandidate)[i].type)) {
                        // add buffer and counter buffer argument qualifier
                        qualifierList.push_back(qual);
                        qualifierList.push_back(qual);
                    } else if (shouldFlatten(*(*fnCandidate)[i].type, (*fnCandidate)[i].type->getQualifier().storage,
                                             true)) {
                        // add structure member expansion
                        for (int memb = 0; memb < (int)(*fnCandidate)[i].type->getStruct()->size(); ++memb)
                            qualifierList.push_back(qual);
                    } else {
                        // Normal 1:1 case
                        qualifierList.push_back(qual);
                    }
                }
            }

            // Convert 'out' arguments.  If it was a constant folded built-in, it won't be an aggregate anymore.
            // Built-ins with a single argument aren't called with an aggregate, but they also don't have an output.
            // Also, build the qualifier list for user function calls, which are always called with an aggregate.
            // We don't do this is if there has been a decomposition, which will have added its own conversions
            // for output parameters.
            if (result == fnNode && result->getAsAggregate())
                result = addOutputArgumentConversions(*fnCandidate, *result->getAsOperator());
        }
    }

    // generic error recovery
    // TODO: simplification: localize all the error recoveries that look like this, and taking type into account to
    //       reduce cascades
    if (result == nullptr)
        result = intermediate.addConstantUnion(0.0, EbtFloat, loc);

    return result;
}